

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::java::anon_unknown_0::GenerateGetBitInternal
                   (string *__return_storage_ptr__,string *prefix,int bitIndex)

{
  string mask;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string varName;
  
  GetBitFieldNameForBit_abi_cxx11_(&mask,(java *)(ulong)(uint)bitIndex,bitIndex);
  std::operator+(&varName,prefix,&mask);
  std::__cxx11::string::~string((string *)&mask);
  std::__cxx11::string::string
            ((string *)&mask,*(char **)(bit_masks + (long)(bitIndex % 0x20) * 8),
             (allocator *)&local_e0);
  std::operator+(&local_c0,"((",&varName);
  std::operator+(&local_a0,&local_c0," & ");
  std::operator+(&local_80,&local_a0,&mask);
  std::operator+(&local_60,&local_80,") == ");
  std::operator+(&local_e0,&local_60,&mask);
  std::operator+(__return_storage_ptr__,&local_e0,")");
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&mask);
  std::__cxx11::string::~string((string *)&varName);
  return __return_storage_ptr__;
}

Assistant:

string GenerateGetBitInternal(const string& prefix, int bitIndex) {
  string varName = prefix + GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  string mask = bit_masks[bitInVarIndex];
  string result = "((" + varName + " & " + mask + ") == " + mask + ")";
  return result;
}